

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O2

string * __thiscall
duckdb::CSVReaderOptions::GetNewline_abi_cxx11_
          (string *__return_storage_ptr__,CSVReaderOptions *this)

{
  NotImplementedException *this_00;
  char *pcVar1;
  allocator local_39;
  string local_38;
  
  switch((this->dialect_options).state_machine_options.new_line.value) {
  case SINGLE_N:
    pcVar1 = "\\n";
    break;
  case CARRY_ON:
    pcVar1 = "\\r\\n";
    break;
  case NOT_SET:
    pcVar1 = anon_var_dwarf_3b2a81b + 9;
    break;
  case SINGLE_R:
    pcVar1 = "\\r";
    break;
  default:
    this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string((string *)&local_38,"New line type not supported",&local_39);
    NotImplementedException::NotImplementedException(this_00,&local_38);
    __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,(allocator *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string CSVReaderOptions::GetNewline() const {
	switch (dialect_options.state_machine_options.new_line.GetValue()) {
	case NewLineIdentifier::CARRY_ON:
		return "\\r\\n";
	case NewLineIdentifier::SINGLE_R:
		return "\\r";
	case NewLineIdentifier::SINGLE_N:
		return "\\n";
	case NewLineIdentifier::NOT_SET:
		return "";
	default:
		throw NotImplementedException("New line type not supported");
	}
}